

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v10::detail::
    get_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
              (basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg)

{
  ulong uVar1;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  switch(arg.value_.field_0.int128_value._8_4_) {
  case 1:
    uVar1 = (ulong)(int)in_stack_00000008;
    break;
  case 2:
    uVar1 = (ulong)in_stack_00000008;
    goto LAB_0019457e;
  case 3:
    uVar1 = CONCAT44(in_stack_0000000c,in_stack_00000008);
    break;
  case 4:
  case 6:
    goto switchD_00194555_caseD_4;
  case 5:
    if (arg.value_.field_0.long_long_value < 0) goto LAB_00194570;
    goto switchD_00194555_caseD_4;
  default:
    throw_format_error("width is not integer");
  }
  if ((long)uVar1 < 0) {
LAB_00194570:
    throw_format_error("negative width");
  }
LAB_0019457e:
  if (uVar1 >> 0x1f == 0) {
    return (int)uVar1;
  }
  throw_format_error("number is too big");
switchD_00194555_caseD_4:
  uVar1 = CONCAT44(in_stack_0000000c,in_stack_00000008);
  goto LAB_0019457e;
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg) -> int {
  unsigned long long value = visit_format_arg(Handler(), arg);
  if (value > to_unsigned(max_value<int>()))
    throw_format_error("number is too big");
  return static_cast<int>(value);
}